

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_read_filter_row_up(png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  png_size_t pVar1;
  png_size_t pVar2;
  
  pVar1 = row_info->rowbytes;
  if (pVar1 != 0) {
    pVar2 = 0;
    do {
      row[pVar2] = row[pVar2] + prev_row[pVar2];
      pVar2 = pVar2 + 1;
    } while (pVar1 != pVar2);
  }
  return;
}

Assistant:

static void
png_read_filter_row_up(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   png_size_t i;
   png_size_t istop = row_info->rowbytes;
   png_bytep rp = row;
   png_const_bytep pp = prev_row;

   for (i = 0; i < istop; i++)
   {
      *rp = (png_byte)(((int)(*rp) + (int)(*pp++)) & 0xff);
      rp++;
   }
}